

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O1

void __thiscall
Assimp::MakeLeftHandedProcess::ProcessMesh(MakeLeftHandedProcess *this,aiMesh *pMesh)

{
  uint uVar1;
  aiVector3D *paVar2;
  aiBone *paVar3;
  long lVar4;
  Logger *this_00;
  ulong uVar5;
  ulong uVar6;
  aiAnimMesh *paVar7;
  
  if (pMesh != (aiMesh *)0x0) {
    if (pMesh->mNumVertices != 0) {
      lVar4 = 8;
      uVar5 = 0;
      do {
        *(uint *)((long)&pMesh->mVertices->x + lVar4) =
             *(uint *)((long)&pMesh->mVertices->x + lVar4) ^ 0x80000000;
        paVar2 = pMesh->mNormals;
        if ((paVar2 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
          *(uint *)((long)&paVar2->x + lVar4) = *(uint *)((long)&paVar2->x + lVar4) ^ 0x80000000;
        }
        paVar2 = pMesh->mTangents;
        if (((paVar2 != (aiVector3D *)0x0) && (pMesh->mBitangents != (aiVector3D *)0x0)) &&
           (pMesh->mNumVertices != 0)) {
          *(uint *)((long)&paVar2->x + lVar4) = *(uint *)((long)&paVar2->x + lVar4) ^ 0x80000000;
          *(uint *)((long)&pMesh->mBitangents->x + lVar4) =
               *(uint *)((long)&pMesh->mBitangents->x + lVar4) ^ 0x80000000;
        }
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0xc;
      } while (uVar5 < pMesh->mNumVertices);
    }
    if (pMesh->mNumAnimMeshes != 0) {
      uVar5 = 0;
      do {
        paVar7 = pMesh->mAnimMeshes[uVar5];
        if (paVar7->mNumVertices != 0) {
          lVar4 = 8;
          uVar6 = 0;
          do {
            *(uint *)((long)&paVar7->mVertices->x + lVar4) =
                 *(uint *)((long)&paVar7->mVertices->x + lVar4) ^ 0x80000000;
            paVar2 = pMesh->mAnimMeshes[uVar5]->mNormals;
            if (paVar2 != (aiVector3D *)0x0) {
              *(uint *)((long)&paVar2->x + lVar4) = *(uint *)((long)&paVar2->x + lVar4) ^ 0x80000000
              ;
            }
            paVar2 = pMesh->mAnimMeshes[uVar5]->mTangents;
            if (paVar2 != (aiVector3D *)0x0) {
              *(uint *)((long)&paVar2->x + lVar4) = *(uint *)((long)&paVar2->x + lVar4) ^ 0x80000000
              ;
              paVar2 = pMesh->mAnimMeshes[uVar5]->mBitangents;
              *(uint *)((long)&paVar2->x + lVar4) = *(uint *)((long)&paVar2->x + lVar4) ^ 0x80000000
              ;
            }
            uVar6 = uVar6 + 1;
            paVar7 = pMesh->mAnimMeshes[uVar5];
            lVar4 = lVar4 + 0xc;
          } while (uVar6 < paVar7->mNumVertices);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < pMesh->mNumAnimMeshes);
    }
    if (pMesh->mNumBones != 0) {
      uVar5 = 0;
      do {
        paVar3 = pMesh->mBones[uVar5];
        (paVar3->mOffsetMatrix).a3 = -(paVar3->mOffsetMatrix).a3;
        (paVar3->mOffsetMatrix).b3 = -(paVar3->mOffsetMatrix).b3;
        (paVar3->mOffsetMatrix).d3 = -(paVar3->mOffsetMatrix).d3;
        (paVar3->mOffsetMatrix).c1 = -(paVar3->mOffsetMatrix).c1;
        (paVar3->mOffsetMatrix).c2 = -(paVar3->mOffsetMatrix).c2;
        (paVar3->mOffsetMatrix).c4 = -(paVar3->mOffsetMatrix).c4;
        uVar5 = uVar5 + 1;
      } while (uVar5 < pMesh->mNumBones);
    }
    if (((pMesh->mTangents != (aiVector3D *)0x0) && (pMesh->mBitangents != (aiVector3D *)0x0)) &&
       ((pMesh->mNumVertices != 0 && (pMesh->mNumVertices != 0)))) {
      lVar4 = 8;
      uVar5 = 0;
      do {
        paVar2 = pMesh->mBitangents;
        uVar1 = *(uint *)((long)&paVar2->x + lVar4);
        *(uint *)((long)paVar2 + lVar4 + -8) = *(uint *)((long)paVar2 + lVar4 + -8) ^ 0x80000000;
        *(uint *)((long)paVar2 + lVar4 + -4) = *(uint *)((long)paVar2 + lVar4 + -4) ^ 0x80000000;
        *(uint *)((long)&paVar2->x + lVar4) = uVar1 ^ 0x80000000;
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0xc;
      } while (uVar5 < pMesh->mNumVertices);
    }
    return;
  }
  this_00 = DefaultLogger::get();
  Logger::error(this_00,"Nullptr to mesh found.");
  return;
}

Assistant:

void MakeLeftHandedProcess::ProcessMesh( aiMesh* pMesh) {
    if ( nullptr == pMesh ) {
        ASSIMP_LOG_ERROR( "Nullptr to mesh found." );
        return;
    }
    // mirror positions, normals and stuff along the Z axis
    for( size_t a = 0; a < pMesh->mNumVertices; ++a)
    {
        pMesh->mVertices[a].z *= -1.0f;
        if (pMesh->HasNormals()) {
            pMesh->mNormals[a].z *= -1.0f;
        }
        if( pMesh->HasTangentsAndBitangents())
        {
            pMesh->mTangents[a].z *= -1.0f;
            pMesh->mBitangents[a].z *= -1.0f;
        }
    }

    // mirror anim meshes positions, normals and stuff along the Z axis
    for (size_t m = 0; m < pMesh->mNumAnimMeshes; ++m)
    {
        for (size_t a = 0; a < pMesh->mAnimMeshes[m]->mNumVertices; ++a)
        {
            pMesh->mAnimMeshes[m]->mVertices[a].z *= -1.0f;
            if (pMesh->mAnimMeshes[m]->HasNormals()) {
                pMesh->mAnimMeshes[m]->mNormals[a].z *= -1.0f;
            }
            if (pMesh->mAnimMeshes[m]->HasTangentsAndBitangents())
            {
                pMesh->mAnimMeshes[m]->mTangents[a].z *= -1.0f;
                pMesh->mAnimMeshes[m]->mBitangents[a].z *= -1.0f;
            }
        }
    }

    // mirror offset matrices of all bones
    for( size_t a = 0; a < pMesh->mNumBones; ++a)
    {
        aiBone* bone = pMesh->mBones[a];
        bone->mOffsetMatrix.a3 = -bone->mOffsetMatrix.a3;
        bone->mOffsetMatrix.b3 = -bone->mOffsetMatrix.b3;
        bone->mOffsetMatrix.d3 = -bone->mOffsetMatrix.d3;
        bone->mOffsetMatrix.c1 = -bone->mOffsetMatrix.c1;
        bone->mOffsetMatrix.c2 = -bone->mOffsetMatrix.c2;
        bone->mOffsetMatrix.c4 = -bone->mOffsetMatrix.c4;
    }

    // mirror bitangents as well as they're derived from the texture coords
    if( pMesh->HasTangentsAndBitangents())
    {
        for( unsigned int a = 0; a < pMesh->mNumVertices; a++)
            pMesh->mBitangents[a] *= -1.0f;
    }
}